

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Start_Resume_PDU.cpp
# Opt level: O3

void __thiscall
KDIS::PDU::Start_Resume_PDU::Start_Resume_PDU
          (Start_Resume_PDU *this,EntityIdentifier *ReceivingEntity,
          EntityIdentifier *SupplyingEntity,ClockTime *RealWorldTime,ClockTime *SimTime,
          KUINT32 ReqID)

{
  KUINT32 KVar1;
  
  Simulation_Management_Header::Simulation_Management_Header
            (&this->super_Simulation_Management_Header,ReceivingEntity,SupplyingEntity);
  (this->super_Simulation_Management_Header).super_Header.super_Header6._vptr_Header6 =
       (_func_int **)&PTR__Start_Resume_PDU_002237b8;
  (this->m_RealWorldTime).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__DataTypeBase_00224840;
  KVar1 = RealWorldTime->m_ui32TimePastHour;
  (this->m_RealWorldTime).m_i32Hour = RealWorldTime->m_i32Hour;
  (this->m_RealWorldTime).m_ui32TimePastHour = KVar1;
  (this->m_SimTime).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__DataTypeBase_00224840;
  KVar1 = SimTime->m_ui32TimePastHour;
  (this->m_SimTime).m_i32Hour = SimTime->m_i32Hour;
  (this->m_SimTime).m_ui32TimePastHour = KVar1;
  this->m_ui32RequestID = ReqID;
  (this->super_Simulation_Management_Header).super_Header.super_Header6.m_ui8PDUType = '\r';
  (this->super_Simulation_Management_Header).super_Header.super_Header6.m_ui16PDULength = 0x2c;
  return;
}

Assistant:

Start_Resume_PDU::Start_Resume_PDU( const EntityIdentifier & ReceivingEntity, const EntityIdentifier & SupplyingEntity,
                                    const ClockTime & RealWorldTime, const ClockTime & SimTime, KUINT32 ReqID ) :
    Simulation_Management_Header( ReceivingEntity, SupplyingEntity ),
    m_RealWorldTime( RealWorldTime ),
    m_SimTime( SimTime ),
    m_ui32RequestID( ReqID )
{
    m_ui8PDUType = Start_Resume_PDU_Type;
    m_ui16PDULength = START_RESUME_PDU_SIZE;
}